

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O2

void __thiscall ncnn::Split::Split(Split *this)

{
  int iVar1;
  bool bVar2;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Layer_0059bf98;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->super_Layer).support_packing = true;
  iVar1 = cpu_support_arm_asimdhp();
  bVar2 = true;
  if (iVar1 == 0) {
    iVar1 = cpu_support_riscv_zvfh();
    bVar2 = iVar1 != 0;
  }
  (this->super_Layer).support_fp16_storage = bVar2;
  (this->super_Layer).support_bf16_storage = true;
  return;
}

Assistant:

Split::Split()
{
    one_blob_only = false;
    support_inplace = false;
    support_packing = true;
    support_fp16_storage = cpu_support_arm_asimdhp() || cpu_support_riscv_zvfh();
    support_bf16_storage = true;
}